

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_deriveBlockSplitsHelper
               (seqStoreSplits *splits,size_t startIdx,size_t endIdx,ZSTD_CCtx *zc,
               seqStore_t *origSeqStore)

{
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong endIdx_00;
  seqStore_t *firstHalfSeqStore;
  seqStore_t *secondHalfSeqStore;
  seqStore_t *fullSeqStoreChunk;
  
  resultSeqStore = &(zc->blockSplitCtx).firstHalfSeqStore;
  resultSeqStore_00 = &(zc->blockSplitCtx).secondHalfSeqStore;
  while( true ) {
    if (endIdx < startIdx) {
      __assert_fail("endIdx >= startIdx",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6089,
                    "void ZSTD_deriveBlockSplitsHelper(seqStoreSplits *, size_t, size_t, ZSTD_CCtx *, const seqStore_t *)"
                   );
    }
    if ((endIdx - startIdx < 300) || (0xc3 < splits->idx)) {
      return;
    }
    endIdx_00 = endIdx + startIdx >> 1;
    ZSTD_deriveSeqStoreChunk(&(zc->blockSplitCtx).fullSeqStoreChunk,origSeqStore,startIdx,endIdx);
    ZSTD_deriveSeqStoreChunk(resultSeqStore,origSeqStore,startIdx,endIdx_00);
    ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,endIdx_00,endIdx);
    sVar1 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                      (&(zc->blockSplitCtx).fullSeqStoreChunk,zc);
    sVar2 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(resultSeqStore,zc);
    sVar3 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(resultSeqStore_00,zc);
    if (0xffffffffffffff88 < sVar1) {
      return;
    }
    if (0xffffffffffffff88 < sVar2) break;
    if (0xffffffffffffff88 < sVar3) {
      return;
    }
    if (sVar1 <= sVar3 + sVar2) {
      return;
    }
    ZSTD_deriveBlockSplitsHelper(splits,startIdx,endIdx_00,zc,origSeqStore);
    sVar1 = splits->idx;
    splits->splitLocations[sVar1] = (U32)endIdx_00;
    splits->idx = sVar1 + 1;
    startIdx = endIdx_00;
  }
  return;
}

Assistant:

static void
ZSTD_deriveBlockSplitsHelper(seqStoreSplits* splits, size_t startIdx, size_t endIdx,
                             ZSTD_CCtx* zc, const seqStore_t* origSeqStore)
{
    seqStore_t* const fullSeqStoreChunk = &zc->blockSplitCtx.fullSeqStoreChunk;
    seqStore_t* const firstHalfSeqStore = &zc->blockSplitCtx.firstHalfSeqStore;
    seqStore_t* const secondHalfSeqStore = &zc->blockSplitCtx.secondHalfSeqStore;
    size_t estimatedOriginalSize;
    size_t estimatedFirstHalfSize;
    size_t estimatedSecondHalfSize;
    size_t midIdx = (startIdx + endIdx)/2;

    DEBUGLOG(5, "ZSTD_deriveBlockSplitsHelper: startIdx=%zu endIdx=%zu", startIdx, endIdx);
    assert(endIdx >= startIdx);
    if (endIdx - startIdx < MIN_SEQUENCES_BLOCK_SPLITTING || splits->idx >= ZSTD_MAX_NB_BLOCK_SPLITS) {
        DEBUGLOG(6, "ZSTD_deriveBlockSplitsHelper: Too few sequences (%zu)", endIdx - startIdx);
        return;
    }
    ZSTD_deriveSeqStoreChunk(fullSeqStoreChunk, origSeqStore, startIdx, endIdx);
    ZSTD_deriveSeqStoreChunk(firstHalfSeqStore, origSeqStore, startIdx, midIdx);
    ZSTD_deriveSeqStoreChunk(secondHalfSeqStore, origSeqStore, midIdx, endIdx);
    estimatedOriginalSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(fullSeqStoreChunk, zc);
    estimatedFirstHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(firstHalfSeqStore, zc);
    estimatedSecondHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(secondHalfSeqStore, zc);
    DEBUGLOG(5, "Estimated original block size: %zu -- First half split: %zu -- Second half split: %zu",
             estimatedOriginalSize, estimatedFirstHalfSize, estimatedSecondHalfSize);
    if (ZSTD_isError(estimatedOriginalSize) || ZSTD_isError(estimatedFirstHalfSize) || ZSTD_isError(estimatedSecondHalfSize)) {
        return;
    }
    if (estimatedFirstHalfSize + estimatedSecondHalfSize < estimatedOriginalSize) {
        DEBUGLOG(5, "split decided at seqNb:%zu", midIdx);
        ZSTD_deriveBlockSplitsHelper(splits, startIdx, midIdx, zc, origSeqStore);
        splits->splitLocations[splits->idx] = (U32)midIdx;
        splits->idx++;
        ZSTD_deriveBlockSplitsHelper(splits, midIdx, endIdx, zc, origSeqStore);
    }
}